

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exploitable.c
# Opt level: O1

int main(int argc,char **argv)

{
  char text [1024];
  char acStack_408 [1024];
  
  if (argc < 2) {
    printf("Usage: %s <text to print>\n",*argv);
    exit(0);
  }
  strcpy(acStack_408,argv[1]);
  printf(acStack_408);
  putchar(10);
  printf("pointer 0x%016lx \t decimal value %d \t hex value 0x%08x\n",&main::test_val,
         (ulong)(uint)main::test_val);
  printf("pointer 0x%016lx \t pointer %p \t hex value 0x%016lx\n",&main::test_ptr,main::test_ptr);
  exit(0);
}

Assistant:

int main(int argc, char * argv[]) {
  char text[1024];
  static int test_val = -72;
  static void * test_ptr = 0;

  if (argc < 2) {
    printf("Usage: %s <text to print>\n", argv[0]);
    exit(0);
  }

  strcpy(text, argv[1]);

  printf(text);
  printf("\n");

  printf("pointer 0x%016" PRIxPTR " \t decimal value %d \t hex value 0x%08x\n", (uintptr_t) &test_val, test_val, test_val);
  printf("pointer 0x%016" PRIxPTR " \t pointer %p \t hex value 0x%016" PRIxPTR "\n", (uintptr_t) &test_ptr, test_ptr, (uintptr_t) test_ptr);

  exit(0);
}